

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_wString PreJuly2023_TextureChildSlotName(ON_RenderMaterial *rm,ChildSlotUsage usage)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_register_00000034;
  ON_Material local_158;
  undefined4 local_1c;
  long *plStack_18;
  ChildSlotUsage usage_local;
  ON_RenderMaterial *rm_local;
  
  plStack_18 = (long *)CONCAT44(in_register_00000034,usage);
  local_1c = in_EDX;
  rm_local = rm;
  (**(code **)(*plStack_18 + 600))();
  bVar1 = ON_Material::IsPhysicallyBased(&local_158);
  ON_Material::~ON_Material(&local_158);
  if (bVar1) {
    PBR_ChildSlotNameFromUsage((ChildSlotUsage)rm);
  }
  else {
    switch(local_1c) {
    case 1:
      ON_wString::ON_wString((ON_wString *)rm,L"bitmap-texture");
      break;
    case 2:
      ON_wString::ON_wString((ON_wString *)rm,L"transparency-texture");
      break;
    default:
      ON_wString::ON_wString((ON_wString *)rm,L"");
      break;
    case 4:
      ON_wString::ON_wString((ON_wString *)rm,L"bump-texture");
      break;
    case 8:
      ON_wString::ON_wString((ON_wString *)rm,L"environment-texture");
    }
  }
  return (ON_wString)(wchar_t *)rm;
}

Assistant:

static ON_wString PreJuly2023_TextureChildSlotName(const ON_RenderMaterial& rm, ChildSlotUsage usage)
{
  if (rm.ToOnMaterial().IsPhysicallyBased())
    return PBR_ChildSlotNameFromUsage(usage);

  switch (usage)
  {
  case ChildSlotUsage::Diffuse:      return ON_TEXTURE_CHILD_SLOT_NAME_BITMAP_TEXTURE;
  case ChildSlotUsage::Bump:         return ON_TEXTURE_CHILD_SLOT_NAME_BUMP_TEXTURE;
  case ChildSlotUsage::Transparency: return ON_TEXTURE_CHILD_SLOT_NAME_TRANSPARENCY_TEXTURE;
  case ChildSlotUsage::Environment:  return ON_TEXTURE_CHILD_SLOT_NAME_ENVIRONMENT_TEXTURE;
  default: return L"";
  }
}